

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O1

void ScaleRowDown2Box_Odd_C(uint8_t *src_ptr,ptrdiff_t src_stride,uint8_t *dst,int dst_width)

{
  byte *pbVar1;
  int iVar2;
  
  if (2 < dst_width) {
    iVar2 = 0;
    do {
      *dst = (uint8_t)((uint)src_ptr[src_stride] + (uint)src_ptr[1] + (uint)*src_ptr +
                       (uint)src_ptr[src_stride + 1] + 2 >> 2);
      dst[1] = (uint8_t)((uint)src_ptr[src_stride + 2] + (uint)src_ptr[3] + (uint)src_ptr[2] +
                         (uint)src_ptr[src_stride + 3] + 2 >> 2);
      dst = dst + 2;
      src_ptr = src_ptr + 4;
      iVar2 = iVar2 + 2;
    } while (iVar2 < dst_width + -2);
  }
  pbVar1 = src_ptr + src_stride;
  if ((dst_width & 1U) == 0) {
    *dst = (uint8_t)((uint)*pbVar1 + (uint)src_ptr[1] + (uint)*src_ptr + (uint)pbVar1[1] + 2 >> 2);
    dst = dst + 1;
    src_ptr = src_ptr + 2;
    pbVar1 = pbVar1 + 2;
  }
  *dst = (uint8_t)((uint)*src_ptr + (uint)*pbVar1 + 1 >> 1);
  return;
}

Assistant:

void ScaleRowDown2Box_Odd_C(const uint8_t* src_ptr,
                            ptrdiff_t src_stride,
                            uint8_t* dst,
                            int dst_width) {
  const uint8_t* s = src_ptr;
  const uint8_t* t = src_ptr + src_stride;
  int x;
  dst_width -= 1;
  for (x = 0; x < dst_width - 1; x += 2) {
    dst[0] = (s[0] + s[1] + t[0] + t[1] + 2) >> 2;
    dst[1] = (s[2] + s[3] + t[2] + t[3] + 2) >> 2;
    dst += 2;
    s += 4;
    t += 4;
  }
  if (dst_width & 1) {
    dst[0] = (s[0] + s[1] + t[0] + t[1] + 2) >> 2;
    dst += 1;
    s += 2;
    t += 2;
  }
  dst[0] = (s[0] + t[0] + 1) >> 1;
}